

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

float __thiscall spvtools::opt::analysis::FloatConstant::GetFloatValue(FloatConstant *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*((this->super_ScalarConstant).super_Constant.type_)->_vptr_Type[0xc])();
  if (*(int *)(CONCAT44(extraout_var,iVar1) + 0x24) == 0x20) {
    iVar1 = (*(this->super_ScalarConstant).super_Constant._vptr_Constant[0x18])(this);
    return **(float **)CONCAT44(extraout_var_00,iVar1);
  }
  __assert_fail("type()->AsFloat()->width() == 32 && \"Not a 32-bit floating point value.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.h"
                ,0xf7,"float spvtools::opt::analysis::FloatConstant::GetFloatValue() const");
}

Assistant:

float GetFloatValue() const {
    assert(type()->AsFloat()->width() == 32 &&
           "Not a 32-bit floating point value.");
    utils::FloatProxy<float> a(words()[0]);
    return a.getAsFloat();
  }